

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

uint64_t __thiscall roaring::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_color _Var6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  
  p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  if (p_Var2 != (_Rb_tree_node_base *)0x0) {
    do {
      _Var6 = (_Rb_tree_color)(x >> 0x20);
      bVar8 = p_Var2[1]._M_color < _Var6;
      if (!bVar8) {
        p_Var7 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar8];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      if (p_Var7[1]._M_color == _Var6) {
        uVar3 = roaring_bitmap_rank((roaring_bitmap_t *)&p_Var7[1]._M_parent,(uint32_t)x);
      }
      else {
        uVar3 = 0;
      }
      goto LAB_001063e6;
    }
  }
  uVar3 = 0;
  p_Var7 = &p_Var1->_M_header;
LAB_001063e6:
  for (p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    uVar4 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var5[1]._M_parent);
    uVar3 = uVar3 + uVar4;
  }
  return uVar3;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t result = 0;
        // Find the first bitmap >= x's bucket. If that is the bucket x would be
        // in, find it's rank in that bucket. Either way, we're left with a
        // range of all buckets strictly smaller than x's bucket, add all their
        // cardinalities together.
        auto end = roarings.lower_bound(highBytes(x));
        if (end != roarings.cend() && end->first == highBytes(x)) {
            result += end->second.rank(lowBytes(x));
        }
        for (auto iter = roarings.cbegin(); iter != end; ++iter) {
            result += iter->second.cardinality();
        }
        return result;
    }